

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

any __thiscall cs_impl::cni::operator()(cni *this,vector *args)

{
  undefined8 in_RDX;
  undefined8 *in_RSI;
  proxy *in_RDI;
  lang_error *e;
  exception *e_1;
  var *in_stack_ffffffffffffff48;
  undefined1 local_20 [32];
  
  (**(code **)(*(long *)*in_RSI + 0x20))(local_20,(long *)*in_RSI,in_RDX);
  cs::try_move(in_stack_ffffffffffffff48);
  any::~any((any *)0x4254d3);
  return (any)in_RDI;
}

Assistant:

any operator()(cs::vector &args) const
		{
			try {
				return cs::try_move(mCni->call(args));
			}
			catch (const cs::lang_error &e) {
				cs::current_process->cs_eh_callback(e);
			}
			catch (const std::exception &e) {
				cs::current_process->std_eh_callback(e);
			}
			catch (...) {
				cs::current_process->std_eh_callback(cs::fatal_error("CNI:Unrecognized exception."));
			}
			return cs::null_pointer;
		}